

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall mp::StringFileWriter::~StringFileWriter(StringFileWriter *this)

{
  FILE *__stream;
  _Manager_type p_Var1;
  undefined8 uVar2;
  undefined8 local_10;
  
  if ((this->cnt_ == 0) && (this->fTriedOpen_ == false)) {
    if ((this->opener_).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    (*(this->opener_)._M_invoker)((_Any_data *)&stack0xfffffffffffffff0,(bool *)&this->opener_);
    if ((FILE *)local_10 != (FILE *)0x0) {
      fclose((FILE *)local_10);
    }
    local_10 = (FILE *)0x0;
  }
  __stream = (FILE *)(this->nm).f_;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  (this->nm).f_ = (FILE *)0x0;
  p_Var1 = (this->opener_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->opener_,(_Any_data *)&this->opener_,__destroy_functor);
  }
  return;
}

Assistant:

~StringFileWriter() {
    if (!cnt_ && !fTriedOpen_)  // remove file if not opened
      opener_(true);            // or nothing written
  }